

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

int mixed_buffer_to_pack(mixed_buffer **ins,mixed_pack *out,float *volume,float target_volume)

{
  float fVar1;
  mixed_encoding encoding;
  mixed_buffer *pmVar2;
  float *pfVar3;
  long lVar4;
  mixed_transfer_function_to p_Var5;
  void *pvVar6;
  char *pcVar7;
  mixed_pack *pack;
  float fVar8;
  byte bVar9;
  byte bVar10;
  uint32_t uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  char cVar15;
  float *pfStack_80;
  float *pfStack_78;
  mixed_transfer_function_to local_70;
  long local_68;
  float *local_60;
  void *local_58;
  char *outd;
  mixed_pack *local_48;
  float local_40;
  uint local_3c;
  float local_38;
  uint32_t local_34 [2];
  uint32_t frames;
  
  bVar10 = out->channels;
  pfStack_80 = (float *)0x12d6cf;
  local_60 = volume;
  local_38 = target_volume;
  bVar9 = mixed_samplesize(out->encoding);
  uVar13 = (uint)bVar9 * (uint)bVar10;
  local_34[0] = 0xffffffff;
  lVar4 = -(ulong)((uint)bVar10 * 8 + 0xf & 0xfffffff0);
  local_68 = (long)&pfStack_78;
  local_48 = out;
  *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d70c;
  mixed_pack_request_write(&local_58,local_34,out);
  local_34[0] = local_34[0] / uVar13;
  outd = (char *)(ulong)bVar10;
  local_3c = uVar13;
  if (bVar10 != 0) {
    uVar12 = 0;
    do {
      pmVar2 = *(mixed_buffer **)((long)ins + uVar12);
      *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d749;
      mixed_buffer_request_read
                ((float **)((long)&pfStack_78 + uVar12 + lVar4 + -0x78 + 0x78),local_34,pmVar2);
      uVar12 = uVar12 + 8;
    } while ((uint)bVar10 * 8 != uVar12);
  }
  pcVar7 = outd;
  iVar14 = (int)outd;
  if (local_34[0] != 0) {
    encoding = local_48->encoding;
    local_70 = transfer_array_functions_to[encoding - MIXED_INT8];
    *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d77a;
    bVar10 = mixed_samplesize(encoding);
    fVar1 = *local_60;
    *local_60 = local_38;
    if (pcVar7 != (char *)0x0) {
      cVar15 = '\0';
      local_40 = fVar1;
      do {
        uVar11 = local_34[0];
        fVar8 = local_38;
        fVar1 = local_40;
        pvVar6 = local_58;
        p_Var5 = local_70;
        pfVar3 = *(float **)((long)&pfStack_78 + (long)cVar15 * 8 + lVar4 + -0x78 + 0x78U);
        *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d7ba;
        (*p_Var5)(pfVar3,pvVar6,(uint8_t)pcVar7,uVar11,fVar1,fVar8);
        local_58 = (void *)((long)local_58 + (ulong)bVar10);
        cVar15 = cVar15 + '\x01';
      } while (cVar15 < iVar14);
    }
  }
  pack = local_48;
  uVar11 = local_3c * local_34[0];
  *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d7df;
  mixed_pack_finish_write(uVar11,pack);
  if (pcVar7 != (char *)0x0) {
    uVar12 = 0;
    do {
      uVar11 = local_34[0];
      pmVar2 = ins[uVar12];
      *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d7f6;
      mixed_buffer_finish_read(uVar11,pmVar2);
      uVar12 = uVar12 + 1;
    } while (((ulong)pcVar7 & 0xffffffff) != uVar12);
  }
  return 1;
}

Assistant:

int mixed_buffer_to_pack(struct mixed_buffer **ins, struct mixed_pack *out, float *volume, float target_volume){
  mixed_channel_t channels = out->channels;
  uint32_t frames_to_bytes = channels * mixed_samplesize(out->encoding);
  uint32_t frames = UINT32_MAX;
  char *outd;
  float *ind[channels];

  mixed_pack_request_write((void**)&outd, &frames, out);
  frames = frames / frames_to_bytes;
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_request_read(&ind[i], &frames, ins[i]);

  if(0 < frames){
    mixed_transfer_function_to fun = transfer_array_functions_to[out->encoding-1];
    uint8_t size = mixed_samplesize(out->encoding);
    float vol = *volume;
    // KLUDGE: this is not necessarily correct...
    *volume = target_volume;
    for(int8_t c=0; c<channels; ++c){
      fun(ind[c], outd, channels, frames, vol, target_volume);
      outd += size;
    }
  }

  mixed_pack_finish_write(frames * frames_to_bytes, out);
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_finish_read(frames, ins[i]);
  
  return 1;
}